

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMethod
          (DescriptorBuilder *this,MethodDescriptor *method,MethodDescriptorProto *proto)

{
  string *psVar1;
  MethodOptions *pMVar2;
  long *plVar3;
  size_type *psVar4;
  Symbol SVar5;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(long *)(method + 0x58) == 0) {
    pMVar2 = MethodOptions::default_instance();
    *(MethodOptions **)(method + 0x58) = pMVar2;
  }
  SVar5 = LookupSymbol(this,(proto->input_type_).ptr_,*(string **)(method + 8),PLACEHOLDER_MESSAGE,
                       LOOKUP_ALL,(bool)(this->pool_->lazily_build_dependencies_ ^ 1));
  if (SVar5.type == MESSAGE) {
    internal::LazyDescriptor::Set((LazyDescriptor *)(method + 0x18),SVar5.field_1.descriptor);
  }
  else if (SVar5.type == NULL_SYMBOL) {
    psVar1 = (proto->input_type_).ptr_;
    if (this->pool_->lazily_build_dependencies_ == false) {
      AddNotDefinedError(this,*(string **)(method + 8),&proto->super_Message,INPUT_TYPE,psVar1);
    }
    else {
      internal::LazyDescriptor::SetLazy((LazyDescriptor *)(method + 0x18),psVar1,this->file_);
    }
  }
  else {
    psVar1 = *(string **)(method + 8);
    std::operator+(&local_48,"\"",(proto->input_type_).ptr_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68.field_2._8_8_ = plVar3[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    AddError(this,psVar1,&proto->super_Message,INPUT_TYPE,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  SVar5 = LookupSymbol(this,(proto->output_type_).ptr_,*(string **)(method + 8),PLACEHOLDER_MESSAGE,
                       LOOKUP_ALL,(bool)(this->pool_->lazily_build_dependencies_ ^ 1));
  if (SVar5.type == MESSAGE) {
    internal::LazyDescriptor::Set((LazyDescriptor *)(method + 0x38),SVar5.field_1.descriptor);
  }
  else if (SVar5.type == NULL_SYMBOL) {
    psVar1 = (proto->output_type_).ptr_;
    if (this->pool_->lazily_build_dependencies_ == false) {
      AddNotDefinedError(this,*(string **)(method + 8),&proto->super_Message,OUTPUT_TYPE,psVar1);
    }
    else {
      internal::LazyDescriptor::SetLazy((LazyDescriptor *)(method + 0x38),psVar1,this->file_);
    }
  }
  else {
    psVar1 = *(string **)(method + 8);
    std::operator+(&local_48,"\"",(proto->output_type_).ptr_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68.field_2._8_8_ = plVar3[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_68._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    AddError(this,psVar1,&proto->super_Message,OUTPUT_TYPE,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMethod(MethodDescriptor* method,
                                        const MethodDescriptorProto& proto) {
  if (method->options_ == nullptr) {
    method->options_ = &MethodOptions::default_instance();
  }

  Symbol input_type =
      LookupSymbol(proto.input_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (input_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::INPUT_TYPE,
                         proto.input_type());
    } else {
      method->input_type_.SetLazy(proto.input_type(), file_);
    }
  } else if (input_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::INPUT_TYPE,
             "\"" + proto.input_type() + "\" is not a message type.");
  } else {
    method->input_type_.Set(input_type.descriptor);
  }

  Symbol output_type =
      LookupSymbol(proto.output_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (output_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::OUTPUT_TYPE,
                         proto.output_type());
    } else {
      method->output_type_.SetLazy(proto.output_type(), file_);
    }
  } else if (output_type.type != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::OUTPUT_TYPE,
             "\"" + proto.output_type() + "\" is not a message type.");
  } else {
    method->output_type_.Set(output_type.descriptor);
  }
}